

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudioVoice_SetOutputVoices(FAudioVoice *voice,FAudioVoiceSends *pSendList)

{
  FAudioVoiceSends *pFVar1;
  uint uVar2;
  FAudioVoiceType FVar3;
  long lVar4;
  FAudioVoice *pFVar5;
  double dVar6;
  FAudioSendDescriptor *pFVar7;
  float **ppfVar8;
  FAudioMixCallback *pp_Var9;
  float *pfVar10;
  code *pcVar11;
  FAudioFilterParameters *pFVar12;
  FAudioFilterState **ppafVar13;
  FAudioFilterState *pafVar14;
  FAudioResampleCallback *pp_Var15;
  undefined **ppuVar16;
  uint uVar17;
  FAudioSendDescriptor *pFVar18;
  float (*pafVar19) [64];
  FAudioSendDescriptor **ppFVar20;
  long lVar21;
  uint32_t uVar22;
  ulong uVar23;
  size_t sVar24;
  double dVar25;
  FAudioSendDescriptor defaultSend;
  FAudioVoiceSends local_4c;
  FAudioSendDescriptor local_3c;
  
  if (voice->type == FAUDIO_VOICE_MASTER) {
    return 0x88960001;
  }
  FAudio_PlatformLockMutex(voice->sendLock);
  if ((voice->sends).SendCount != 0) {
    uVar23 = 0;
    do {
      (*voice->audio->pFree)(voice->sendCoefficients[uVar23]);
      uVar23 = uVar23 + 1;
    } while (uVar23 < (voice->sends).SendCount);
  }
  if (voice->sendCoefficients != (float **)0x0) {
    (*voice->audio->pFree)(voice->sendCoefficients);
  }
  if (voice->sendMix != (FAudioMixCallback *)0x0) {
    (*voice->audio->pFree)(voice->sendMix);
  }
  if (voice->sendFilter != (FAudioFilterParameters *)0x0) {
    (*voice->audio->pFree)(voice->sendFilter);
    voice->sendFilter = (FAudioFilterParameters *)0x0;
  }
  pFVar1 = &voice->sends;
  if (voice->sendFilterState != (FAudioFilterState **)0x0) {
    if (pFVar1->SendCount != 0) {
      uVar23 = 0;
      do {
        if (voice->sendFilterState[uVar23] != (FAudioFilterState *)0x0) {
          (*voice->audio->pFree)(voice->sendFilterState[uVar23]);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < pFVar1->SendCount);
    }
    (*voice->audio->pFree)(voice->sendFilterState);
    voice->sendFilterState = (FAudioFilterState **)0x0;
  }
  pFVar18 = (voice->sends).pSends;
  if (pFVar18 != (FAudioSendDescriptor *)0x0) {
    (*voice->audio->pFree)(pFVar18);
  }
  if (pSendList == (FAudioVoiceSends *)0x0) {
    local_3c.Flags = 0;
    local_3c.pOutputVoice = voice->audio->master;
    pSendList = &local_4c;
    local_4c.SendCount = 1;
    ppFVar20 = &local_4c.pSends;
    local_4c.pSends = &local_3c;
  }
  else {
    if (pSendList->SendCount == 0) {
      voice->sendFilter = (FAudioFilterParameters *)0x0;
      voice->sendFilterState = (FAudioFilterState **)0x0;
      voice->sendCoefficients = (float **)0x0;
      voice->sendMix = (FAudioMixCallback *)0x0;
      SDL_memset(pFVar1,0,0xc);
      goto LAB_00113416;
    }
    ppFVar20 = &pSendList->pSends;
  }
  (voice->sends).SendCount = pSendList->SendCount;
  pFVar7 = (FAudioSendDescriptor *)(*voice->audio->pMalloc)((ulong)pSendList->SendCount * 0xc);
  (voice->sends).pSends = pFVar7;
  pFVar18 = *ppFVar20;
  SDL_memcpy(pFVar7,pFVar18,(ulong)pSendList->SendCount * 0xc);
  uVar17 = (uint)pFVar18;
  ppfVar8 = (float **)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
  voice->sendCoefficients = ppfVar8;
  pp_Var9 = (FAudioMixCallback *)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
  voice->sendMix = pp_Var9;
  if (pSendList->SendCount != 0) {
    lVar21 = 0;
    uVar23 = 0;
    do {
      lVar4 = *(long *)((long)&(*ppFVar20)->pOutputVoice + lVar21);
      uVar2 = *(uint *)((ulong)(*(int *)(lVar4 + 0xc) != 2) * 0x10 + 0xd0 + lVar4);
      pfVar10 = (float *)(*voice->audio->pMalloc)((ulong)voice->outputChannels * (ulong)uVar2 * 4);
      voice->sendCoefficients[uVar23] = pfVar10;
      pafVar19 = FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1] + (uVar2 - 1);
      SDL_memcpy(voice->sendCoefficients[uVar23],pafVar19,
                 (ulong)(voice->outputChannels * uVar2) << 2);
      uVar17 = (uint)pafVar19;
      if (voice->outputChannels == 2) {
        pcVar11 = FAudio_INTERNAL_Mix_Generic_Scalar;
        if (uVar2 - 1 < 8) {
          ppuVar16 = &PTR_FAudio_INTERNAL_Mix_2in_1out_Scalar_0012cb18;
          goto LAB_001131f1;
        }
      }
      else {
        pcVar11 = FAudio_INTERNAL_Mix_Generic_Scalar;
        if ((voice->outputChannels == 1) &&
           (pcVar11 = FAudio_INTERNAL_Mix_Generic_Scalar, uVar2 - 1 < 8)) {
          ppuVar16 = &PTR_FAudio_INTERNAL_Mix_1in_1out_Scalar_0012cad8;
LAB_001131f1:
          pcVar11 = (code *)ppuVar16[uVar2 - 1];
        }
      }
      voice->sendMix[uVar23] = pcVar11;
      if ((*(byte *)((long)&(*ppFVar20)->Flags + lVar21) & 0x80) != 0) {
        if (voice->sendFilter == (FAudioFilterParameters *)0x0) {
          pFVar12 = (FAudioFilterParameters *)
                    (*voice->audio->pMalloc)((ulong)pSendList->SendCount * 0xc);
          voice->sendFilter = pFVar12;
        }
        if (voice->sendFilterState == (FAudioFilterState **)0x0) {
          ppafVar13 = (FAudioFilterState **)
                      (*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
          voice->sendFilterState = ppafVar13;
          SDL_memset(ppafVar13,0,(ulong)pSendList->SendCount << 3);
        }
        pFVar12 = voice->sendFilter;
        *(undefined4 *)((long)&pFVar12->Type + lVar21) = 0;
        *(undefined8 *)((long)&pFVar12->Frequency + lVar21) = 0x3f8000003f800000;
        sVar24 = (ulong)uVar2 << 4;
        pafVar14 = (FAudioFilterState *)(*voice->audio->pMalloc)(sVar24);
        voice->sendFilterState[uVar23] = pafVar14;
        uVar17 = 0;
        SDL_memset(voice->sendFilterState[uVar23],0,sVar24);
      }
      uVar23 = uVar23 + 1;
      lVar21 = lVar21 + 0xc;
    } while (uVar23 < pSendList->SendCount);
  }
  pFVar5 = ((voice->sends).pSends)->pOutputVoice;
  dVar25 = (double)*(uint *)((long)&pFVar5->field_18 +
                            (ulong)(pFVar5->type != FAUDIO_VOICE_MASTER) * 0x10 + 0x14);
  dVar6 = (double)SDL_ceil(SUB84(((double)voice->audio->updateSize * dVar25) /
                                 (double)(voice->audio->master->field_18).master.inputSampleRate,0))
  ;
  FVar3 = voice->type;
  if (FVar3 == FAUDIO_VOICE_MASTER) {
    uVar17 = (voice->field_18).master.inputChannels;
  }
  else if (FVar3 == FAUDIO_VOICE_SUBMIX) {
    uVar17 = (voice->field_18).mix.inputChannels;
  }
  else if (FVar3 == FAUDIO_VOICE_SOURCE) {
    uVar17 = (uint)((voice->field_18).src.format)->nChannels;
  }
  uVar22 = (uint32_t)(long)dVar6;
  FAudio_INTERNAL_ResizeResampleCache(voice->audio,uVar17 * uVar22);
  if (voice->type == FAUDIO_VOICE_SOURCE) {
    (voice->field_18).src.resampleSamples = uVar22;
    goto LAB_00113416;
  }
  (voice->field_18).src.resampleSamples = uVar22;
  dVar25 = ((double)(voice->field_18).mix.inputSampleRate / dVar25) * 4294967296.0 + 0.5;
  uVar23 = (ulong)dVar25;
  uVar23 = (long)(dVar25 - 9.223372036854776e+18) & (long)uVar23 >> 0x3f | uVar23;
  (voice->field_18).src.resampleStep = uVar23;
  uVar17 = (voice->field_18).mix.inputChannels;
  if ((voice->field_18).src.decodeSamples / uVar17 <
      (uint)(((long)dVar6 & 0xffffffffU) * uVar23 >> 0x20)) {
    (voice->field_18).src.resampleSamples = uVar22 - 1;
  }
  if (uVar17 == 2) {
    pp_Var15 = &FAudio_INTERNAL_ResampleStereo;
LAB_00113403:
    pcVar11 = *pp_Var15;
  }
  else {
    if (uVar17 == 1) {
      pp_Var15 = &FAudio_INTERNAL_ResampleMono;
      goto LAB_00113403;
    }
    pcVar11 = FAudio_INTERNAL_ResampleGeneric;
  }
  (voice->field_18).mix.resample = pcVar11;
LAB_00113416:
  FAudio_PlatformUnlockMutex(voice->sendLock);
  return 0;
}

Assistant:

uint32_t FAudioVoice_SetOutputVoices(
	FAudioVoice *voice,
	const FAudioVoiceSends *pSendList
) {
	uint32_t i;
	uint32_t outChannels;
	uint32_t channelCount;
	uint32_t outSampleRate;
	uint32_t newResampleSamples;
	uint64_t resampleSanityCheck;
	FAudioVoiceSends defaultSends;
	FAudioSendDescriptor defaultSend;

	LOG_API_ENTER(voice->audio)

	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* FIXME: This is lazy... */
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		voice->audio->pFree(voice->sendCoefficients[i]);
	}
	if (voice->sendCoefficients != NULL)
	{
		voice->audio->pFree(voice->sendCoefficients);
	}
	if (voice->sendMix != NULL)
	{
		voice->audio->pFree(voice->sendMix);
	}
	if (voice->sendFilter != NULL)
	{
		voice->audio->pFree(voice->sendFilter);
		voice->sendFilter = NULL;
	}
	if (voice->sendFilterState != NULL)
	{
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			if (voice->sendFilterState[i] != NULL)
			{
				voice->audio->pFree(voice->sendFilterState[i]);
			}
		}
		voice->audio->pFree(voice->sendFilterState);
		voice->sendFilterState = NULL;
	}
	if (voice->sends.pSends != NULL)
	{
		voice->audio->pFree(voice->sends.pSends);
	}

	if (pSendList == NULL)
	{
		/* Default to the mastering voice as output */
		defaultSend.Flags = 0;
		defaultSend.pOutputVoice = voice->audio->master;
		defaultSends.SendCount = 1;
		defaultSends.pSends = &defaultSend;
		pSendList = &defaultSends;
	}
	else if (pSendList->SendCount == 0)
	{
		/* No sends? Nothing to do... */
		voice->sendCoefficients = NULL;
		voice->sendMix = NULL;
		voice->sendFilter = NULL;
		voice->sendFilterState = NULL;
		FAudio_zero(&voice->sends, sizeof(FAudioVoiceSends));
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)

		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Copy send list */
	voice->sends.SendCount = pSendList->SendCount;
	voice->sends.pSends = (FAudioSendDescriptor*) voice->audio->pMalloc(
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);
	FAudio_memcpy(
		voice->sends.pSends,
		pSendList->pSends,
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);

	/* Allocate/Reset default output matrix, mixer function, filters */
	voice->sendCoefficients = (float**) voice->audio->pMalloc(
		sizeof(float*) * pSendList->SendCount
	);
	voice->sendMix = (FAudioMixCallback*) voice->audio->pMalloc(
		sizeof(FAudioMixCallback) * pSendList->SendCount
	);
	for (i = 0; i < pSendList->SendCount; i += 1)
	{
		if (pSendList->pSends[i].pOutputVoice->type == FAUDIO_VOICE_MASTER)
		{
			outChannels = pSendList->pSends[i].pOutputVoice->master.inputChannels;
		}
		else
		{
			outChannels = pSendList->pSends[i].pOutputVoice->mix.inputChannels;
		}
		voice->sendCoefficients[i] = (float*) voice->audio->pMalloc(
			sizeof(float) * voice->outputChannels * outChannels
		);

		FAudio_assert(voice->outputChannels > 0 && voice->outputChannels < 9);
		FAudio_assert(outChannels > 0 && outChannels < 9);
		FAudio_memcpy(
			voice->sendCoefficients[i],
			FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1][outChannels - 1],
			voice->outputChannels * outChannels * sizeof(float)
		);

		if (voice->outputChannels == 1)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic_Scalar;
			}
		}
		else if (voice->outputChannels == 2)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic_Scalar;
			}
		}
		else
		{
			voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic_Scalar;
		}

		if (pSendList->pSends[i].Flags & FAUDIO_SEND_USEFILTER)
		{
			/* Allocate the whole send filter array if needed... */
			if (voice->sendFilter == NULL)
			{
				voice->sendFilter = (FAudioFilterParameters*) voice->audio->pMalloc(
					sizeof(FAudioFilterParameters) * pSendList->SendCount
				);
			}
			if (voice->sendFilterState == NULL)
			{
				voice->sendFilterState = (FAudioFilterState**) voice->audio->pMalloc(
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
				FAudio_zero(
					voice->sendFilterState,
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
			}

			/* ... then fill in this send's filter data */
			voice->sendFilter[i].Type = FAUDIO_DEFAULT_FILTER_TYPE;
			voice->sendFilter[i].Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			voice->sendFilter[i].OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			voice->sendFilterState[i] = (FAudioFilterState*) voice->audio->pMalloc(
				sizeof(FAudioFilterState) * outChannels
			);
			FAudio_zero(
				voice->sendFilterState[i],
				sizeof(FAudioFilterState) * outChannels
			);
		}
	}

	/* Allocate resample cache */
	outSampleRate = voice->sends.pSends[0].pOutputVoice->type == FAUDIO_VOICE_MASTER ?
		voice->sends.pSends[0].pOutputVoice->master.inputSampleRate :
		voice->sends.pSends[0].pOutputVoice->mix.inputSampleRate;
	newResampleSamples = (uint32_t) FAudio_ceil(
		voice->audio->updateSize *
		(double) outSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	);
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		channelCount = voice->src.format->nChannels;
	}
	else if (voice->type == FAUDIO_VOICE_SUBMIX)
	{
		channelCount = voice->mix.inputChannels;
	}
	else if (voice->type == FAUDIO_VOICE_MASTER)
	{
		channelCount = voice->master.inputChannels;
	}
	FAudio_INTERNAL_ResizeResampleCache(
		voice->audio,
		newResampleSamples * channelCount
	);
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		voice->src.resampleSamples = newResampleSamples;
	}
	else
	{
		voice->mix.outputSamples = newResampleSamples;

		voice->mix.resampleStep = DOUBLE_TO_FIXED((
			(double) voice->mix.inputSampleRate /
			(double) outSampleRate
		));

		/* Because we used ceil earlier, there's a chance that
		 * downsampling submixes will go past the number of samples
		 * available. Sources can do this thanks to padding, but we
		 * don't have that luxury for submixes, so unfortunately we
		 * just have to undo the ceil and turn it into a floor.
		 * -flibit
		 */
		resampleSanityCheck = (
			voice->mix.resampleStep * voice->mix.outputSamples
		) >> FIXED_PRECISION;
		if (resampleSanityCheck > (voice->mix.inputSamples / voice->mix.inputChannels))
		{
			voice->mix.outputSamples -= 1;
		}

		if (voice->mix.inputChannels == 1)
		{
			voice->mix.resample = FAudio_INTERNAL_ResampleMono;
		}
		else if (voice->mix.inputChannels == 2)
		{
			voice->mix.resample = FAudio_INTERNAL_ResampleStereo;
		}
		else
		{
			voice->mix.resample = FAudio_INTERNAL_ResampleGeneric;
		}
	}

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}